

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_fastprojectile.cpp
# Opt level: O1

void __thiscall AFastProjectile::Effect(AFastProjectile *this)

{
  double dVar1;
  _func_void_void_ptr *p_Var2;
  AActor *pAVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PClass *pPVar6;
  PClassActor *type;
  AActor *pAVar7;
  double dVar8;
  DVector3 local_28;
  
  if ((this->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
    iVar4 = (**(this->super_AActor).super_DThinker.super_DObject._vptr_DObject)(this);
    (this->super_AActor).super_DThinker.super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4)
    ;
  }
  pPVar6 = (this->super_AActor).super_DThinker.super_DObject.Class;
  iVar4 = *(int *)&pPVar6[1].field_0xd4;
  if (iVar4 == 0) {
    return;
  }
  dVar1 = (this->super_AActor).__Pos.Z;
  dVar8 = (this->super_AActor).floorz;
  if (pPVar6 == (PClass *)0x0) {
    iVar5 = (**(this->super_AActor).super_DThinker.super_DObject._vptr_DObject)(this);
    (this->super_AActor).super_DThinker.super_DObject.Class =
         (PClass *)CONCAT44(extraout_var_00,iVar5);
  }
  p_Var2 = (this->super_AActor).super_DThinker.super_DObject.Class[1].ConstructNative;
  local_28.X = (double)CONCAT44(local_28.X._4_4_,iVar4);
  pPVar6 = PClass::FindClass((FName *)&local_28);
  type = dyn_cast<PClassActor>((DObject *)pPVar6);
  if (type == (PClassActor *)0x0) {
    return;
  }
  dVar1 = dVar1 + -8.0;
  if (dVar8 <= dVar1) {
    dVar8 = dVar1;
  }
  local_28.Z = dVar8 + (double)p_Var2;
  local_28.X = (this->super_AActor).__Pos.X;
  local_28.Y = (this->super_AActor).__Pos.Y;
  pAVar7 = AActor::StaticSpawn(type,&local_28,ALLOW_REPLACE,false);
  if (pAVar7 == (AActor *)0x0) {
    return;
  }
  if ((((this->super_AActor).flags5.Value & 2) != 0) &&
     (pAVar3 = (this->super_AActor).target.field_0.p, pAVar3 != (AActor *)0x0)) {
    if (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      (pAVar7->target).field_0 = (this->super_AActor).target.field_0;
      goto LAB_005e3e3f;
    }
    (this->super_AActor).target.field_0.p = (AActor *)0x0;
  }
  (pAVar7->target).field_0.p = &this->super_AActor;
LAB_005e3e3f:
  (pAVar7->Angles).Pitch.Degrees = (this->super_AActor).Angles.Pitch.Degrees;
  (pAVar7->Angles).Yaw.Degrees = (this->super_AActor).Angles.Yaw.Degrees;
  return;
}

Assistant:

void AFastProjectile::Effect()
{
	FName name = GetClass()->MissileName;
	if (name != NAME_None)
	{
		double hitz = Z()-8;

		if (hitz < floorz)
		{
			hitz = floorz;
		}
		// Do not clip this offset to the floor.
		hitz += GetClass()->MissileHeight;
		
		PClassActor *trail = PClass::FindActor(name);
		if (trail != NULL)
		{
			AActor *act = Spawn (trail, PosAtZ(hitz), ALLOW_REPLACE);
			if (act != nullptr)
			{
				if ((flags5 & MF5_GETOWNER) && (target != nullptr))
					act->target = target;
				else
					act->target = this;
				
				act->Angles.Pitch = Angles.Pitch;
				act->Angles.Yaw = Angles.Yaw;
			}
		}
	}
}